

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O3

void __thiscall
FastPForLib::FastBinaryPacking<32U>::encodeArray
          (FastBinaryPacking<32U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 (*pauVar4) [64];
  undefined1 (*pauVar5) [64];
  uint uVar6;
  uint32_t i;
  long lVar7;
  uint32_t *puVar8;
  uint32_t *out_00;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  uint32_t Bs [4];
  uint local_68 [6];
  uint32_t *local_50;
  size_t *local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  local_48 = nvalue;
  checkifdivisibleby(length,0x80);
  out_00 = out + 1;
  *out = (uint32_t)length;
  local_50 = out;
  if (0x7f < (long)length) {
    local_40 = in + length;
    puVar8 = in + 0x80;
    pauVar5 = (undefined1 (*) [64])(in + 0x10);
    do {
      pauVar4 = pauVar5;
      lVar7 = 0;
      do {
        auVar10 = vmovdqu64_avx512f(pauVar4[-1]);
        auVar10 = vpord_avx512f(auVar10,*pauVar4);
        auVar9 = vextracti64x4_avx512f(auVar10,1);
        auVar10 = vpord_avx512f(auVar10,ZEXT3264(auVar9));
        auVar2 = vpor_avx(auVar10._0_16_,auVar10._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpor_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpor_avx(auVar2,auVar3);
        uVar6 = 0x20 - LZCOUNT(auVar2._0_4_);
        if (auVar2._0_4_ == 0) {
          uVar6 = 0;
        }
        lVar1 = lVar7 + 1;
        pauVar4 = pauVar4 + 2;
        local_68[lVar7] = uVar6;
        lVar7 = lVar1;
      } while (lVar1 != 4);
      lVar7 = 0;
      *out_00 = local_68[2] << 8 | local_68[1] << 0x10 | local_68[0] << 0x18 | local_68[3];
      out_00 = out_00 + 1;
      local_38 = in;
      do {
        uVar6 = local_68[lVar7];
        fastpackwithoutmask(in,out_00,uVar6);
        out_00 = out_00 + uVar6;
        lVar7 = lVar7 + 1;
        in = in + 0x20;
      } while (lVar7 != 4);
      puVar8 = puVar8 + 0x80;
      pauVar5 = pauVar5 + 8;
      in = local_38 + 0x80;
    } while (puVar8 <= local_40);
  }
  *local_48 = (long)out_00 - (long)local_50 >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) override {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    for (const uint32_t *const final = in + length; in + BlockSize <= final;
         in += BlockSize) {
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          out = fastpackwithoutmask_8(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 16)
          out = fastpackwithoutmask_16(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 24)
          out = fastpackwithoutmask_24(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastpackwithoutmask(in + i * MiniBlockSize, out, Bs[i]);
          out += Bs[i];

        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
  }